

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall asmjit::ZoneHashBase::_rehash(ZoneHashBase *this,uint32_t newCount)

{
  uint uVar1;
  ZoneHeap *this_00;
  ZoneHashNode **p;
  ZoneHashNode *pZVar2;
  ZoneHashNode *pZVar3;
  ZoneHashNode **ppZVar4;
  ulong uVar5;
  ulong extraout_RDX;
  ulong size;
  ulong uVar6;
  size_t sStack_28;
  
  this_00 = this->_heap;
  if (this_00 == (ZoneHeap *)0x0) {
    _rehash();
LAB_001681b8:
    _rehash();
LAB_001681bd:
    _rehash();
  }
  else {
    if (this_00->_zone == (Zone *)0x0) goto LAB_001681b8;
    p = this->_data;
    ppZVar4 = (ZoneHashNode **)ZoneHeap::_allocZeroed(this_00,(ulong)newCount << 3,&sStack_28);
    if (ppZVar4 == (ZoneHashNode **)0x0) {
      return;
    }
    uVar1 = this->_bucketsCount;
    uVar6 = (ulong)uVar1;
    size = extraout_RDX;
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        pZVar3 = p[uVar5];
        while (pZVar3 != (ZoneHashNode *)0x0) {
          pZVar2 = *(ZoneHashNode **)pZVar3;
          size = (ulong)*(uint *)(pZVar3 + 8) % (ulong)newCount;
          *(ZoneHashNode **)pZVar3 = ppZVar4[size];
          ppZVar4[size] = pZVar3;
          pZVar3 = pZVar2;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar6);
    }
    if (p == this->_embedded) {
LAB_00168179:
      this->_bucketsCount = newCount;
      this->_bucketsGrow = (newCount * 9) / 10;
      this->_data = ppZVar4;
      return;
    }
    if (this->_heap->_zone == (Zone *)0x0) goto LAB_001681bd;
    if (p != (ZoneHashNode **)0x0) {
      if (uVar6 != 0) {
        if (uVar1 < 0x41) {
          _rehash();
        }
        else {
          ZoneHeap::_releaseDynamic(this->_heap,p,size);
        }
        goto LAB_00168179;
      }
      goto LAB_001681c7;
    }
  }
  _rehash();
LAB_001681c7:
  _rehash();
}

Assistant:

void ZoneHashBase::_rehash(uint32_t newCount) noexcept {
  ASMJIT_ASSERT(isInitialized());

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    _heap->allocZeroed(static_cast<size_t>(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hMod = node->_hVal % newCount;

      node->_hashNext = newData[hMod];
      newData[hMod] = node;

      node = next;
    }
  }

  // 90% is the maximum occupancy, can't overflow since the maximum capacity
  // is limited to the last prime number stored in the prime table.
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _bucketsCount = newCount;
  _bucketsGrow = newCount * 9 / 10;

  _data = newData;
}